

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O0

int __thiscall jrtplib::RTPPacket::ParseRawPacket(RTPPacket *this,RTPRawPacket *rawpack)

{
  bool bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint uVar4;
  int iVar5;
  uint32_t uVar6;
  size_t sVar7;
  uint *puVar8;
  bool bVar9;
  uint16_t *puStack_60;
  uint16_t exthdrlen;
  RTPExtensionHeader *rtpextheader;
  int numpadbytes;
  int payloadlength;
  int payloadoffset;
  bool hasextension;
  int csrccount;
  bool marker;
  RTPHeader *rtpheader;
  uint8_t payloadtype;
  size_t packetlen;
  uint8_t *packetbytes;
  RTPRawPacket *rawpack_local;
  RTPPacket *this_local;
  
  bVar1 = RTPRawPacket::IsRTP(rawpack);
  if (bVar1) {
    sVar7 = RTPRawPacket::GetDataLength(rawpack);
    if (sVar7 < 0xc) {
      this_local._4_4_ = -0x19;
    }
    else {
      puVar8 = (uint *)RTPRawPacket::GetData(rawpack);
      if (((byte)((ushort)*puVar8 >> 6) & 3) == 2) {
        bVar1 = (*puVar8 >> 0xf & 1) != 0;
        bVar2 = (byte)((ushort)*puVar8 >> 8) & 0x7f;
        if (bVar1) {
          if (bVar2 == 0x48) {
            return -0x19;
          }
          if (bVar2 == 0x49) {
            return -0x19;
          }
        }
        uVar4 = (uint)((byte)(ushort)*puVar8 & 0xf);
        iVar5 = uVar4 * 4;
        numpadbytes = iVar5 + 0xc;
        if (((ushort)*puVar8 >> 5 & 1) == 0) {
          rtpextheader._0_4_ = 0;
        }
        else {
          rtpextheader._0_4_ = (uint)*(byte *)((long)puVar8 + (sVar7 - 1));
          if ((uint)rtpextheader == 0) {
            return -0x19;
          }
        }
        bVar9 = (*puVar8 >> 4 & 1) != 0;
        if (bVar9) {
          puStack_60 = (uint16_t *)((long)puVar8 + (long)numpadbytes);
          uVar3 = ntohs(puStack_60[1]);
          numpadbytes = iVar5 + 0x10 + (uint)uVar3 * 4;
        }
        else {
          puStack_60 = (uint16_t *)0x0;
        }
        iVar5 = ((int)sVar7 - (uint)rtpextheader) - numpadbytes;
        if (iVar5 < 0) {
          this_local._4_4_ = -0x19;
        }
        else {
          this->hasextension = bVar9;
          if (bVar9) {
            uVar3 = ntohs(*puStack_60);
            this->extid = uVar3;
            uVar3 = ntohs(puStack_60[1]);
            this->extensionlength = (long)(int)(uint)uVar3 << 2;
            this->extension = (uint8_t *)(puStack_60 + 2);
          }
          this->hasmarker = bVar1;
          this->numcsrcs = uVar4;
          this->payloadtype = bVar2;
          uVar3 = ntohs(*(ushort *)((long)puVar8 + 2));
          this->extseqnr = (uint)uVar3;
          uVar6 = ntohl(puVar8[1]);
          this->timestamp = uVar6;
          uVar6 = ntohl(puVar8[2]);
          this->ssrc = uVar6;
          this->packet = (uint8_t *)puVar8;
          this->payload = (uint8_t *)((long)puVar8 + (long)numpadbytes);
          this->packetlength = sVar7;
          this->payloadlength = (long)iVar5;
          RTPRawPacket::ZeroData(rawpack);
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -0x19;
      }
    }
  }
  else {
    this_local._4_4_ = -0x19;
  }
  return this_local._4_4_;
}

Assistant:

int RTPPacket::ParseRawPacket(RTPRawPacket &rawpack)
{
	uint8_t *packetbytes;
	size_t packetlen;
	uint8_t payloadtype;
	RTPHeader *rtpheader;
	bool marker;
	int csrccount;
	bool hasextension;
	int payloadoffset,payloadlength;
	int numpadbytes;
	RTPExtensionHeader *rtpextheader;
	
	if (!rawpack.IsRTP()) // If we didn't receive it on the RTP port, we'll ignore it
		return ERR_RTP_PACKET_INVALIDPACKET;
	
	// The length should be at least the size of the RTP header
	packetlen = rawpack.GetDataLength();
	if (packetlen < sizeof(RTPHeader))
		return ERR_RTP_PACKET_INVALIDPACKET;
	
	packetbytes = (uint8_t *)rawpack.GetData();
	rtpheader = (RTPHeader *)packetbytes;
	
	// The version number should be correct
	if (rtpheader->version != RTP_VERSION)
		return ERR_RTP_PACKET_INVALIDPACKET;
	
	// We'll check if this is possibly a RTCP packet. For this to be possible
	// the marker bit and payload type combined should be either an SR or RR
	// identifier
	marker = (rtpheader->marker == 0)?false:true;
	payloadtype = rtpheader->payloadtype;
	if (marker)
	{
		if (payloadtype == (RTP_RTCPTYPE_SR & 127)) // don't check high bit (this was the marker!!)
			return ERR_RTP_PACKET_INVALIDPACKET;
		if (payloadtype == (RTP_RTCPTYPE_RR & 127))
			return ERR_RTP_PACKET_INVALIDPACKET;
	}

	csrccount = rtpheader->csrccount;
	payloadoffset = sizeof(RTPHeader)+(int)(csrccount*sizeof(uint32_t));
	
	if (rtpheader->padding) // adjust payload length to take padding into account
	{
		numpadbytes = (int)packetbytes[packetlen-1]; // last byte contains number of padding bytes
		if (numpadbytes <= 0)
			return ERR_RTP_PACKET_INVALIDPACKET;
	}
	else
		numpadbytes = 0;

	hasextension = (rtpheader->extension == 0)?false:true;
	if (hasextension) // got header extension
	{
		rtpextheader = (RTPExtensionHeader *)(packetbytes+payloadoffset);
		payloadoffset += sizeof(RTPExtensionHeader);
		
		uint16_t exthdrlen = ntohs(rtpextheader->length);
		payloadoffset += ((int)exthdrlen)*sizeof(uint32_t);
	}
	else
	{
		rtpextheader = 0;
	}	
	
	payloadlength = packetlen-numpadbytes-payloadoffset;
	if (payloadlength < 0)
		return ERR_RTP_PACKET_INVALIDPACKET;

	// Now, we've got a valid packet, so we can create a new instance of RTPPacket
	// and fill in the members
	
	RTPPacket::hasextension = hasextension;
	if (hasextension)
	{
		RTPPacket::extid = ntohs(rtpextheader->extid);
		RTPPacket::extensionlength = ((int)ntohs(rtpextheader->length))*sizeof(uint32_t);
		RTPPacket::extension = ((uint8_t *)rtpextheader)+sizeof(RTPExtensionHeader);
	}

	RTPPacket::hasmarker = marker;
	RTPPacket::numcsrcs = csrccount;
	RTPPacket::payloadtype = payloadtype;
	
	// Note: we don't fill in the EXTENDED sequence number here, since we
	// don't have information about the source here. We just fill in the low
	// 16 bits
	RTPPacket::extseqnr = (uint32_t)ntohs(rtpheader->sequencenumber);

	RTPPacket::timestamp = ntohl(rtpheader->timestamp);
	RTPPacket::ssrc = ntohl(rtpheader->ssrc);
	RTPPacket::packet = packetbytes;
	RTPPacket::payload = packetbytes+payloadoffset;
	RTPPacket::packetlength = packetlen;
	RTPPacket::payloadlength = payloadlength;

	// We'll zero the data of the raw packet, since we're using it here now!
	rawpack.ZeroData();

	return 0;
}